

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerUnion.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
llvm::
PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
::get<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
          (PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
           *this)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  ValTy local_18;
  PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
  *local_10;
  PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
  *this_local;
  
  local_10 = this;
  iVar1 = is<std::vector<unsigned_char,std::allocator<unsigned_char>>*>(this);
  if (iVar1 == 0) {
    __assert_fail("is<T>() && \"Invalid accessor called\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerUnion.h"
                  ,0x189,
                  "T llvm::PointerUnion4<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PT1 = std::vector<unsigned char> *, PT2 = std::vector<unsigned short> *, PT3 = std::vector<unsigned int> *, PT4 = std::vector<unsigned long> *, T = std::vector<unsigned char> *]"
                 );
  }
  local_18.Value =
       (intptr_t)
       PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
       ::
       get<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>>
                 ((PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                   *)this);
  pvVar2 = PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>
           ::get<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
                     ((PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>
                       *)&local_18);
  return pvVar2;
}

Assistant:

T get() const {
    assert(is<T>() && "Invalid accessor called");
    // If T is PT1/PT2 choose InnerUnion1 otherwise choose InnerUnion2.
    using Ty = typename ::llvm::PointerUnionTypeSelector<
        PT1, T, InnerUnion1,
        ::llvm::PointerUnionTypeSelector<PT2, T, InnerUnion1,
                                         InnerUnion2>>::Return;
    return Val.template get<Ty>().template get<T>();
  }